

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O0

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
          (cmGeneratorExpressionDAGChecker *this,cmGeneratorTarget *tgt)

{
  bool bVar1;
  int iVar2;
  bool local_3a;
  bool local_39;
  char *local_38;
  char *prop;
  cmGeneratorExpressionDAGChecker *parent;
  cmGeneratorExpressionDAGChecker *top;
  cmGeneratorTarget *tgt_local;
  cmGeneratorExpressionDAGChecker *this_local;
  
  parent = this;
  for (prop = (char *)this->Parent; prop != (char *)0x0; prop = *(char **)prop) {
    parent = (cmGeneratorExpressionDAGChecker *)prop;
  }
  top = (cmGeneratorExpressionDAGChecker *)tgt;
  tgt_local = (cmGeneratorTarget *)this;
  local_38 = (char *)std::__cxx11::string::c_str();
  if (top == (cmGeneratorExpressionDAGChecker *)0x0) {
    iVar2 = strcmp(local_38,"LINK_LIBRARIES");
    local_3a = true;
    if (iVar2 != 0) {
      iVar2 = strcmp(local_38,"LINK_INTERFACE_LIBRARIES");
      local_3a = true;
      if (iVar2 != 0) {
        iVar2 = strcmp(local_38,"IMPORTED_LINK_INTERFACE_LIBRARIES");
        local_3a = true;
        if (iVar2 != 0) {
          bVar1 = cmHasLiteralPrefix<char_const*,26ul>(&local_38,(char (*) [26])0x8812de);
          local_3a = true;
          if (!bVar1) {
            bVar1 = cmHasLiteralPrefix<char_const*,35ul>
                              (&local_38,(char (*) [35])"IMPORTED_LINK_INTERFACE_LIBRARIES_");
            local_3a = true;
            if (!bVar1) {
              iVar2 = strcmp(local_38,"INTERFACE_LINK_LIBRARIES");
              local_3a = iVar2 == 0;
            }
          }
        }
      }
    }
    this_local._7_1_ = local_3a;
  }
  else {
    local_39 = false;
    if (parent->Target == (cmGeneratorTarget *)top) {
      iVar2 = strcmp(local_38,"LINK_LIBRARIES");
      local_39 = iVar2 == 0;
    }
    this_local._7_1_ = local_39;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries(
  cmGeneratorTarget const* tgt)
{
  const cmGeneratorExpressionDAGChecker* top = this;
  const cmGeneratorExpressionDAGChecker* parent = this->Parent;
  while (parent) {
    top = parent;
    parent = parent->Parent;
  }

  const char* prop = top->Property.c_str();

  if (tgt) {
    return top->Target == tgt && strcmp(prop, "LINK_LIBRARIES") == 0;
  }

  return (strcmp(prop, "LINK_LIBRARIES") == 0 ||
          strcmp(prop, "LINK_INTERFACE_LIBRARIES") == 0 ||
          strcmp(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES") == 0 ||
          cmHasLiteralPrefix(prop, "LINK_INTERFACE_LIBRARIES_") ||
          cmHasLiteralPrefix(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES_")) ||
    strcmp(prop, "INTERFACE_LINK_LIBRARIES") == 0;
}